

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_external_replayer_linux.hpp
# Opt level: O3

bool __thiscall
Fossilize::ExternalReplayer::Impl::get_failed
          (Impl *this,
          vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
          *failed,size_t *count,uint *indices,Hash *hashes)

{
  uint *puVar1;
  pointer ppVar2;
  pointer ppVar3;
  long lVar4;
  
  if (hashes == (Hash *)0x0) {
    *count = (long)(failed->
                   super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(failed->
                   super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 4;
    return true;
  }
  ppVar2 = (failed->
           super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  ppVar3 = (failed->
           super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (*count == (long)ppVar3 - (long)ppVar2 >> 4) {
    if (ppVar2 != ppVar3) {
      lVar4 = 0;
      do {
        puVar1 = &ppVar2->first + lVar4;
        *(uint *)((long)indices + lVar4) = *puVar1;
        *(unsigned_long *)((long)hashes + lVar4 * 2) = *(unsigned_long *)(puVar1 + 2);
        lVar4 = lVar4 + 4;
      } while ((pointer)(puVar1 + 4) != ppVar3);
    }
    return true;
  }
  return false;
}

Assistant:

bool ExternalReplayer::Impl::get_failed(const std::vector<std::pair<unsigned, Hash>> &failed,
                                        size_t *count, unsigned *indices, Hash *hashes) const
{
	if (hashes)
	{
		if (*count != failed.size())
			return false;

		for (auto &mod : failed)
		{
			*indices++ = mod.first;
			*hashes++ = mod.second;
		}
		return true;
	}
	else
	{
		*count = failed.size();
		return true;
	}
}